

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O0

FormatFlags deqp::gls::FboUtil::formatFlag(GLenum context)

{
  undefined4 local_c;
  GLenum context_local;
  
  if (context == 0) {
    local_c = ANY_FORMAT;
  }
  else if (context == 0x1702) {
    local_c = TEXTURE_VALID;
  }
  else if (context == 0x8d00) {
    local_c = DEPTH_RENDERABLE;
  }
  else if (context == 0x8d20) {
    local_c = STENCIL_RENDERABLE;
  }
  else if (context == 0x8d41) {
    local_c = RENDERBUFFER_VALID;
  }
  else {
    local_c = COLOR_RENDERABLE;
  }
  return local_c;
}

Assistant:

FormatFlags formatFlag (GLenum context)
{
	switch (context)
	{
		case GL_NONE:
			return FormatFlags(0);
		case GL_RENDERBUFFER:
			return RENDERBUFFER_VALID;
		case GL_TEXTURE:
			return TEXTURE_VALID;
		case GL_STENCIL_ATTACHMENT:
			return STENCIL_RENDERABLE;
		case GL_DEPTH_ATTACHMENT:
			return DEPTH_RENDERABLE;
		default:
			DE_ASSERT(context >= GL_COLOR_ATTACHMENT0 && context <= GL_COLOR_ATTACHMENT15);
			return COLOR_RENDERABLE;
	}
}